

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O2

int uv_uptime(double *uptime)

{
  int iVar1;
  int *piVar2;
  timespec now;
  char buf [128];
  
  iVar1 = uv__slurp("/proc/uptime",buf,0x80);
  if ((iVar1 == 0) && (iVar1 = sscanf(buf,"%lf",uptime), iVar1 == 1)) {
    return 0;
  }
  iVar1 = clock_gettime(7,(timespec *)&now);
  if (iVar1 == 0) {
    *uptime = (double)now.tv_sec;
    iVar1 = 0;
  }
  else {
    piVar2 = __errno_location();
    iVar1 = -*piVar2;
  }
  return iVar1;
}

Assistant:

int uv_uptime(double* uptime) {
  struct timespec now;
  char buf[128];

  /* Consult /proc/uptime when present (common case), or fall back to
   * clock_gettime. Why not always clock_gettime? It doesn't always return the
   * right result under OpenVZ and possibly other containerized environments.
   */
  if (0 == uv__slurp("/proc/uptime", buf, sizeof(buf)))
    if (1 == sscanf(buf, "%lf", uptime))
      return 0;

  if (clock_gettime(CLOCK_BOOTTIME, &now))
    return UV__ERR(errno);

  *uptime = now.tv_sec;
  return 0;
}